

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O0

bool ReadSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  bool bVar1;
  exception *this;
  pointer this_00;
  element_type *peVar2;
  mapped_type *pmVar3;
  allocator<char> local_101;
  key_type local_100;
  string local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  CylHead local_78;
  undefined1 local_70 [8];
  shared_ptr<SCPDevDisk> scp_dev_disk;
  int fw_version;
  int hw_version;
  unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> supercardpro;
  string local_40;
  shared_ptr<Disk> *local_20;
  shared_ptr<Disk> *disk_local;
  string *path_local;
  
  local_20 = disk;
  disk_local = (shared_ptr<Disk> *)path;
  util::lowercase(&local_40,path);
  bVar1 = std::operator!=(&local_40,"scp:");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    path_local._7_1_ = 0;
  }
  else {
    SuperCardPro::Open();
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&fw_version);
    if (!bVar1) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,util::exception::~exception);
    }
    scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = 0;
    scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = 0;
    this_00 = std::unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_>::operator->
                        ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&fw_version
                        );
    SuperCardPro::GetInfo
              (this_00,(int *)((long)&scp_dev_disk.
                                      super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 4),
               (int *)&scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::make_shared<SCPDevDisk,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)local_70);
    peVar2 = std::__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_70);
    CylHead::CylHead(&local_78,0x52,1);
    DemandDisk::extend(&peVar2->super_DemandDisk,&local_78);
    VersionString_abi_cxx11_
              (&local_98,
               scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
    peVar2 = std::__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"hw_version",&local_b9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(peVar2->super_DemandDisk).super_Disk.metadata,&local_b8);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)&local_98);
    VersionString_abi_cxx11_
              (&local_e0,
               (int)scp_dev_disk.super___shared_ptr<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    peVar2 = std::__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"fw_version",&local_101)
    ;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(peVar2->super_DemandDisk).super_Disk.metadata,&local_100);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)&local_e0);
    peVar2 = std::__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SCPDevDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_70);
    std::__cxx11::string::operator=
              ((string *)&(peVar2->super_DemandDisk).super_Disk.strType,"SuperCard Pro");
    std::shared_ptr<Disk>::operator=(local_20,(shared_ptr<SCPDevDisk> *)local_70);
    path_local._7_1_ = 1;
    std::shared_ptr<SCPDevDisk>::~shared_ptr((shared_ptr<SCPDevDisk> *)local_70);
    std::unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_>::~unique_ptr
              ((unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&fw_version);
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool ReadSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    // ToDo: use path to select from multiple devices?
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    int hw_version = 0, fw_version = 0;
    supercardpro->GetInfo(hw_version, fw_version);

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    scp_dev_disk->extend(CylHead(83 - 1, 2 - 1));

    scp_dev_disk->metadata["hw_version"] = VersionString(hw_version);
    scp_dev_disk->metadata["fw_version"] = VersionString(fw_version);

    scp_dev_disk->strType = "SuperCard Pro";
    disk = scp_dev_disk;

    return true;
}